

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O0

int tokthset1(void *ctx0,toksdef *sym,mcmon objn)

{
  int iVar1;
  long lVar2;
  ushort in_DX;
  undefined1 *in_RSI;
  long in_RDI;
  tokseadef *ctx;
  
  if ((in_RSI[6] == *(char *)(in_RDI + 0xe)) &&
     (iVar1 = memcmp(in_RSI + 7,(void *)(in_RDI + 0xf),(ulong)*(byte *)(in_RDI + 0xe)), iVar1 == 0))
  {
    *(undefined2 *)(in_RSI + 2) = *(undefined2 *)(in_RDI + 10);
    *in_RSI = *(undefined1 *)(in_RDI + 8);
    lVar2 = *(long *)(*(long *)**(undefined8 **)(in_RDI + 0x40) +
                     (long)((int)(uint)*(ushort *)
                                        (*(long *)(*(long *)(in_RDI + 0x40) + 0x30 +
                                                  (long)((int)(uint)in_DX >> 8) * 8) +
                                        (long)(int)(in_DX & 0xff) * 2) >> 8) * 8) +
            (long)(int)(*(ushort *)
                         (*(long *)(*(long *)(in_RDI + 0x40) + 0x30 +
                                   (long)((int)(uint)in_DX >> 8) * 8) +
                         (long)(int)(in_DX & 0xff) * 2) & 0xff) * 0x20;
    *(ushort *)(lVar2 + 0x14) = *(ushort *)(lVar2 + 0x14) | 1;
    return 1;
  }
  return 0;
}

Assistant:

static int tokthset1(void *ctx0, toksdef *sym, mcmon objn)
{
    tokseadef *ctx = (tokseadef *)ctx0;
    
    if (sym->tokslen == ctx->tokseasym.tokslen
        && !memcmp(sym->toksnam, ctx->tokseasym.toksnam,
                   ctx->tokseasym.tokslen))
    {
        sym->toksval = ctx->tokseasym.toksval;
        sym->tokstyp = ctx->tokseasym.tokstyp;
            
        /* touch object, since it's been changed */
        mcmtch(ctx->tokseamctx, objn);
        return(TRUE);
    }
    else
        return(FALSE);
}